

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void __thiscall asio::detail::thread_info_base::capture_current_exception(thread_info_base *this)

{
  long lVar1;
  undefined8 uVar2;
  void *__tmp;
  multiple_exceptions local_40;
  undefined **local_30;
  long local_28;
  
  if (*(int *)(this[2].reusable_memory_ + 2) == 1) {
    *(undefined4 *)(this[2].reusable_memory_ + 2) = 2;
    lVar1 = *(long *)&this[2].has_pending_exception_;
    if (lVar1 != 0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    local_30 = &PTR__multiple_exceptions_0054f528;
    local_28 = lVar1;
    std::make_exception_ptr<asio::multiple_exceptions>(&local_40);
    uVar2 = local_40._0_8_;
    local_40._0_8_ = 0;
    local_40.first_._M_exception_object = *(void **)&this[2].has_pending_exception_;
    *(undefined8 *)&this[2].has_pending_exception_ = uVar2;
    if (local_40.first_._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_40._0_8_ != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    local_30 = &PTR__multiple_exceptions_0054f528;
    if (local_28 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    std::exception::~exception((exception *)&local_30);
  }
  else if (*(int *)(this[2].reusable_memory_ + 2) == 0) {
    *(undefined4 *)(this[2].reusable_memory_ + 2) = 1;
    std::current_exception();
    uVar2 = local_40._0_8_;
    local_40._0_8_ = 0;
    local_40.first_._M_exception_object = *(void **)&this[2].has_pending_exception_;
    *(undefined8 *)&this[2].has_pending_exception_ = uVar2;
    if (local_40.first_._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_40._0_8_ != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  return;
}

Assistant:

void capture_current_exception()
  {
#if !defined(ASIO_NO_EXCEPTIONS)
    switch (has_pending_exception_)
    {
    case 0:
      has_pending_exception_ = 1;
      pending_exception_ = std::current_exception();
      break;
    case 1:
      has_pending_exception_ = 2;
      pending_exception_ =
        std::make_exception_ptr<multiple_exceptions>(
            multiple_exceptions(pending_exception_));
      break;
    default:
      break;
    }
#endif // !defined(ASIO_NO_EXCEPTIONS)
  }